

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<MyTestType,false,std::allocator<unsigned_long>>::coordinatesToOffset<unsigned_long*>
          (View<MyTestType,false,std::allocator<unsigned_long>> *this,unsigned_long *it,size_t *out)

{
  ulong uVar1;
  unsigned_long uVar2;
  size_t sVar3;
  runtime_error *this_00;
  ulong dimension;
  
  View<MyTestType,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this);
  *out = 0;
  if (*(long *)this != 0) {
    dimension = 0;
    do {
      if (*(ulong *)(this + 0x28) <= dimension) {
        return;
      }
      uVar1 = it[dimension];
      sVar3 = View<MyTestType,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this,dimension);
      if (sVar3 <= uVar1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
        goto LAB_002263ee;
      }
      uVar2 = it[dimension];
      sVar3 = View<MyTestType,_false,_std::allocator<unsigned_long>_>::strides
                        ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this,dimension);
      *out = *out + sVar3 * uVar2;
      dimension = dimension + 1;
    } while (*(long *)this != 0);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_002263ee:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
View<T, isConst, A>::coordinatesToOffset
(
    CoordinateIterator it,
    std::size_t& out
) const
{
    testInvariant();
    out = 0;
    for(std::size_t j=0; j<this->dimension(); ++j, ++it) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || static_cast<std::size_t>(*it) < shape(j));
        out += static_cast<std::size_t>(*it) * strides(j);
    }
}